

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O2

int zueci_gbk_u(uchar *src,zueci_u32 len,uint flags,zueci_u32 *p_u)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  zueci_u32 zVar7;
  int iVar8;
  
  bVar1 = *src;
  zVar7 = (zueci_u32)bVar1;
  if (-1 < (char)bVar1) {
    iVar8 = 1;
    goto LAB_0019972d;
  }
  if (len < 2) {
    return 0;
  }
  if (bVar1 == 0x80) {
    return 0;
  }
  if (bVar1 == 0xff) {
    return 0;
  }
  bVar2 = src[1];
  if ((byte)(bVar2 + 1) < 0x41 || bVar2 == 0x7f) {
    return 0;
  }
  iVar8 = 2;
  if ((byte)(bVar1 + 0x5f) < 9) {
    if (0xa0 < bVar2) {
      if (bVar2 == 0xa4 && bVar1 == 0xa1) {
        zVar7 = 0xb7;
        goto LAB_0019972d;
      }
      if (bVar2 == 0xaa && bVar1 == 0xa1) {
        zVar7 = 0x2014;
        goto LAB_0019972d;
      }
LAB_001997b5:
      iVar3 = zueci_gb2312_u(src,len,flags,p_u);
      if (iVar3 != 0) {
        return 2;
      }
    }
  }
  else if ((byte)(bVar1 + 0x50) < 0x48 && 0xa0 < bVar2) goto LAB_001997b5;
  if ((zVar7 * 0x100 + (uint)bVar2) - 0xa1a4 < 0x5cac) {
    uVar4 = zVar7 * 0x100 | (uint)bVar2;
    iVar6 = 0xd0;
    iVar3 = 0;
    while (iVar3 <= iVar6) {
      iVar5 = iVar6 + iVar3 >> 1;
      if (zueci_gbk_nonuro_mb[iVar5] < uVar4) {
        iVar3 = iVar5 + 1;
      }
      else {
        if (zueci_gbk_nonuro_mb[iVar5] <= uVar4) {
          zVar7 = (zueci_u32)zueci_gbk_nonuro_u[iVar5];
          goto LAB_0019972d;
        }
        iVar6 = iVar5 + -1;
      }
    }
  }
  if (bVar1 < 0xa1) {
    iVar6 = -0x5ffe;
    iVar3 = 0xbe;
  }
  else {
    if (0xa0 < bVar2 || bVar1 < 0xa8) {
      return 0;
    }
    iVar6 = -0x2780;
    iVar3 = 0x60;
  }
  iVar3 = iVar3 * zVar7 + iVar6 + (uint)bVar2 + (int)((char)bVar2 >> 7);
  if (0x380f < iVar3) {
    return 0;
  }
  zVar7 = (zueci_u32)zueci_gbk_mb_u[iVar3];
  if (zVar7 == 0) {
    return 0;
  }
LAB_0019972d:
  *p_u = zVar7;
  return iVar8;
}

Assistant:

static int zueci_gbk_u(const unsigned char *src, const zueci_u32 len, const unsigned int flags, zueci_u32 *p_u) {
    unsigned char c1, c2;
    int ind;
    zueci_u32 u2;
    zueci_u16 mb;

    (void)flags;
    assert(len);

    c1 = src[0];
    if (c1 < 0x80) {
        *p_u = c1;
        return 1;
    }
    if (len < 2 || c1 < 0x81 || c1 == 0xFF) {
        return 0;
    }
    c2 = src[1];
    if (c2 < 0x40 || c2 == 0x7F || c2 == 0xFF) {
        return 0;
    }

    /* Try GB 2312 first */
    if (((c1 >= 0xA1 && c1 <= 0xA9) || (c1 >= 0xB0 && c1 <= 0xF7)) && c2 >= 0xA1) {
        if (c1 == 0xA1 && c2 == 0xA4) {
            *p_u = 0x00B7; /* MIDDLE DOT */
            return 2;
        }
        if (c1 == 0xA1 && c2 == 0xAA) {
            *p_u = 0x2014; /* EM DASH */
            return 2;
        }
        if (zueci_gb2312_u(src, len, 0 /*flags*/, p_u)) {
            return 2;
        }
    }

    /* Non-URO? */
    mb = ((zueci_u16) c1 << 8) | c2;
    if (mb >= zueci_gbk_nonuro_mb[0] && mb <= zueci_gbk_nonuro_mb[ZUECI_ASIZE(zueci_gbk_nonuro_mb) - 1]) {
        int s = 0;
        int e = ZUECI_ASIZE(zueci_gbk_nonuro_mb) - 1;
        while (s <= e) {
            const int m = (s + e) >> 1;
            if (zueci_gbk_nonuro_mb[m] < mb) {
                s = m + 1;
            } else if (zueci_gbk_nonuro_mb[m] > mb) {
                e = m - 1;
            } else {
                *p_u = zueci_gbk_nonuro_u[m];
                return 2;
            }
        }
    }

    if (c1 >= 0xA1 && (c1 <= 0xA7 || (c1 >= 0xA8 && c2 >= 0xA1))) {
        return 0;
    }
    if (c1 >= 0xA8) {
        ind = (0xFF - 0x40 - 1) * (0xA1 - 0x81) + (0xA1 - 0x40 - 1) * (c1 - 0xA8) + c2 - 0x40 - (c2 > 0x7F);
    } else {
        ind = (0xFF - 0x40 - 1) * (c1 - 0x81) + c2 - 0x40 - (c2 > 0x7F);
    }
    if (ind < ZUECI_ASIZE(zueci_gbk_mb_u) && (u2 = zueci_gbk_mb_u[ind])) {
        *p_u = u2;
        return 2;
    }
    return 0;
}